

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 floatx80_round_to_int_mips(floatx80 a,float_status *status)

{
  undefined1 auVar1 [12];
  ushort uVar2;
  ushort uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  bool bVar10;
  floatx80 fVar11;
  floatx80 fVar12;
  
  uVar8 = a._8_8_;
  uVar6 = a.low;
  uVar9 = a._8_4_;
  uVar2 = a.high;
  uVar3 = uVar2 & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)uVar6)
  {
    status->float_exception_flags = status->float_exception_flags | 1;
    if (status->snan_bit_is_one != '\0') {
      __assert_fail("!snan_bit_is_one(status)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat-specialize.inc.c"
                    ,0xc5,"floatx80 floatx80_default_nan_mips(float_status *)");
    }
    uVar8 = CONCAT62(a._10_6_,0xffff);
    uVar6 = 0xc000000000000000;
    goto LAB_00720de3;
  }
  if (0x403d < uVar3) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
        uVar3 == 0x7fff) {
      auVar1 = a._0_12_;
      fVar11._12_4_ = 0;
      fVar11.low = auVar1._0_8_;
      fVar11.high = auVar1._8_2_;
      fVar11._10_2_ = auVar1._10_2_;
      fVar11 = propagateFloatx80NaN_mips(a,fVar11,status);
      uVar8 = (ulong)fVar11._8_4_;
      uVar6 = fVar11.low;
    }
    goto LAB_00720de3;
  }
  if (uVar3 < 0x3fff) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 &&
        ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0)
    goto LAB_00720de3;
    status->float_exception_flags = status->float_exception_flags | 0x20;
    uVar7 = uVar9 & 0x8000;
    uVar6 = 0;
    switch(status->float_rounding_mode) {
    case '\0':
      uVar6 = 0;
      if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
          uVar3 == 0x3ffe) {
        uVar6 = 0x8000000000000000;
        uVar7 = uVar9 | 0x3fff;
      }
      break;
    case '\x01':
      uVar8 = (ulong)((uint)(int)(short)uVar2 >> 0xf & 0xbfff);
      uVar6 = (ulong)(uVar9 & 0x8000) << 0x30;
      goto LAB_00720de3;
    case '\x02':
      uVar6 = 0;
      uVar8 = 0x8000;
      if (-1 < (short)uVar2) {
        uVar8 = 0x3fff;
        uVar6 = 0x8000000000000000;
      }
      goto LAB_00720de3;
    case '\x04':
      uVar6 = 0;
      if (uVar3 == 0x3ffe) {
        uVar6 = 0x8000000000000000;
        uVar7 = uVar9 | 0x3fff;
      }
    }
    uVar8 = (ulong)uVar7;
    goto LAB_00720de3;
  }
  uVar8 = 1L << (0x3eU - (char)uVar3 & 0x3f);
  if (4 < (byte)status->float_rounding_mode) {
    abort();
  }
  uVar5 = uVar8 - 1;
  uVar4 = uVar6;
  switch(status->float_rounding_mode) {
  case '\0':
    uVar4 = (uVar8 >> 1) + uVar6;
    if ((uVar4 & uVar5) == 0) {
      uVar4 = uVar4 & ~uVar8;
    }
    break;
  case '\x01':
    uVar4 = 0;
    if ((short)uVar2 < 0) {
      uVar4 = uVar5;
    }
    goto LAB_00720d5b;
  case '\x02':
    if ((short)uVar2 < 0) {
      uVar5 = 0;
    }
    uVar4 = uVar5 + uVar6;
    break;
  case '\x04':
    uVar4 = uVar8 >> 1;
LAB_00720d5b:
    uVar4 = uVar4 + uVar6;
  }
  uVar4 = -uVar8 & uVar4;
  uVar5 = 0x8000000000000000;
  if (uVar4 != 0) {
    uVar5 = uVar4;
  }
  uVar8 = (ulong)(uVar9 + (uVar4 == 0));
  bVar10 = uVar5 != uVar6;
  uVar6 = uVar5;
  if (bVar10) {
    status->float_exception_flags = status->float_exception_flags | 0x20;
  }
LAB_00720de3:
  fVar12._8_8_ = uVar8 & 0xffffffff;
  fVar12.low = uVar6;
  return fVar12;
}

Assistant:

floatx80 floatx80_round_to_int(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t lastBitMask, roundBitsMask;
    floatx80 z;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aExp = extractFloatx80Exp( a );
    if ( 0x403E <= aExp ) {
        if ( ( aExp == 0x7FFF ) && (uint64_t) ( extractFloatx80Frac( a )<<1 ) ) {
            return propagateFloatx80NaN(a, a, status);
        }
        return a;
    }
    if ( aExp < 0x3FFF ) {
        if (    ( aExp == 0 )
             && ( (uint64_t) ( extractFloatx80Frac( a )<<1 ) == 0 ) ) {
            return a;
        }
        status->float_exception_flags |= float_flag_inexact;
        aSign = extractFloatx80Sign( a );
        switch (status->float_rounding_mode) {
         case float_round_nearest_even:
            if ( ( aExp == 0x3FFE ) && (uint64_t) ( extractFloatx80Frac( a )<<1 )
               ) {
                return
                    packFloatx80( aSign, 0x3FFF, UINT64_C(0x8000000000000000));
            }
            break;
        case float_round_ties_away:
            if (aExp == 0x3FFE) {
                return packFloatx80(aSign, 0x3FFF, UINT64_C(0x8000000000000000));
            }
            break;
         case float_round_down:
            return
                  aSign ?
                      packFloatx80( 1, 0x3FFF, UINT64_C(0x8000000000000000))
                : packFloatx80( 0, 0, 0 );
         case float_round_up:
            return
                  aSign ? packFloatx80( 1, 0, 0 )
                : packFloatx80( 0, 0x3FFF, UINT64_C(0x8000000000000000));
        }
        return packFloatx80( aSign, 0, 0 );
    }
    lastBitMask = 1;
    lastBitMask <<= 0x403E - aExp;
    roundBitsMask = lastBitMask - 1;
    z = a;
    switch (status->float_rounding_mode) {
    case float_round_nearest_even:
        z.low += lastBitMask>>1;
        if ((z.low & roundBitsMask) == 0) {
            z.low &= ~lastBitMask;
        }
        break;
    case float_round_ties_away:
        z.low += lastBitMask >> 1;
        break;
    case float_round_to_zero:
        break;
    case float_round_up:
        if (!extractFloatx80Sign(z)) {
            z.low += roundBitsMask;
        }
        break;
    case float_round_down:
        if (extractFloatx80Sign(z)) {
            z.low += roundBitsMask;
        }
        break;
    default:
        abort();
    }
    z.low &= ~ roundBitsMask;
    if ( z.low == 0 ) {
        ++z.high;
        z.low = UINT64_C(0x8000000000000000);
    }
    if (z.low != a.low) {
        status->float_exception_flags |= float_flag_inexact;
    }
    return z;

}